

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

void Gia_ManIllustrateBoxes(Gia_Man_t *p)

{
  Tim_Man_t *p_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  uint iBox;
  uint uVar7;
  int iVar8;
  int local_4c;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  uVar1 = Tim_ManBoxNum(p_00);
  local_4c = Tim_ManPiNum(p_00);
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  iVar8 = 0;
  for (iBox = 0; iBox != uVar1; iBox = iBox + 1) {
    uVar2 = Tim_ManBoxInputNum(p_00,iBox);
    uVar3 = Tim_ManBoxOutputNum(p_00,iBox);
    printf("Box %4d  [%d x %d] :   ",(ulong)iBox,(ulong)uVar2,(ulong)uVar3);
    printf("Input obj IDs = ");
    uVar7 = 0;
    iVar5 = iVar8;
    if (0 < (int)uVar2) {
      uVar7 = uVar2;
    }
    while (uVar7 != 0) {
      pGVar6 = Gia_ManCo(p,iVar5);
      uVar4 = Gia_ObjId(p,pGVar6);
      printf("%d ",(ulong)uVar4);
      uVar7 = uVar7 - 1;
      iVar5 = iVar5 + 1;
    }
    printf("  Output obj IDs = ");
    uVar7 = 0;
    iVar5 = local_4c;
    if (0 < (int)uVar3) {
      uVar7 = uVar3;
    }
    while (uVar7 != 0) {
      pGVar6 = Gia_ManCi(p,iVar5);
      uVar4 = Gia_ObjId(p,pGVar6);
      printf("%d ",(ulong)uVar4);
      uVar7 = uVar7 - 1;
      iVar5 = iVar5 + 1;
    }
    iVar8 = iVar8 + uVar2;
    local_4c = local_4c + uVar3;
    putchar(10);
  }
  iVar5 = Tim_ManPoNum(p_00);
  if (local_4c != p->vCis->nSize) {
    __assert_fail("curCi == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                  ,0xac,"void Gia_ManIllustrateBoxes(Gia_Man_t *)");
  }
  if (iVar5 + iVar8 != p->vCos->nSize) {
    __assert_fail("curCo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                  ,0xad,"void Gia_ManIllustrateBoxes(Gia_Man_t *)");
  }
  return;
}

Assistant:

void Gia_ManIllustrateBoxes( Gia_Man_t * p )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    int nBoxes = Tim_ManBoxNum( pManTime );
    int i, k, curCi, curCo, nBoxIns, nBoxOuts;
    Gia_Obj_t * pObj;
    // walk through the boxes
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < nBoxes; i++ )
    {
        nBoxIns = Tim_ManBoxInputNum(pManTime, i);
        nBoxOuts = Tim_ManBoxOutputNum(pManTime, i);
        printf( "Box %4d  [%d x %d] :   ", i, nBoxIns, nBoxOuts );
        printf( "Input obj IDs = " );
        for ( k = 0; k < nBoxIns; k++ )
        {
            pObj = Gia_ManCo( p, curCo + k );
            printf( "%d ", Gia_ObjId(p, pObj) );
        }
        printf( "  Output obj IDs = " );
        for ( k = 0; k < nBoxOuts; k++ )
        {
            pObj = Gia_ManCi( p, curCi + k );
            printf( "%d ", Gia_ObjId(p, pObj) );
        }
        curCo += nBoxIns;
        curCi += nBoxOuts;
        printf( "\n" );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
}